

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O2

void injection::InjectionManager::bind<ITest>(function<ITest_*()> *maker,InjectionScope scope)

{
  InjectionEngine<ITest> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  function<ITest_*()> local_30;
  
  std::function<ITest_*()>::function(&local_30,maker);
  injection_private::InjectionEngine<ITest>::config(local_40,&local_30,SET,scope);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return;
}

Assistant:

static void bind(std::function<I*()> maker, InjectionScope scope) {
        static injection_private::InjectionEngine<I> phony;
        phony.config(maker, injection_private::InjectionCommand::SET, scope);
    }